

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Keyword(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
          *this,Static_String *t_s)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  char *pcVar7;
  bool local_59;
  bool retval;
  Position start;
  Depth_Counter local_20;
  Depth_Counter dc;
  Static_String *t_s_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
               *)t_s;
  Depth_Counter::Depth_Counter(&local_20,this);
  SkipWS(this,false);
  iVar4 = (this->m_position).line;
  iVar5 = (this->m_position).col;
  pcVar1 = (this->m_position).m_pos;
  pcVar2 = (this->m_position).m_end;
  uVar3 = *(undefined8 *)&(this->m_position).m_last_col;
  local_59 = Keyword_(this,(Static_String *)dc.parser);
  if ((local_59) && (bVar6 = Position::has_more(&this->m_position), bVar6)) {
    pcVar7 = Position::operator*(&this->m_position);
    bVar6 = char_in_alphabet(this,*pcVar7,keyword_alphabet);
    if (bVar6) {
      (this->m_position).line = iVar4;
      (this->m_position).col = iVar5;
      (this->m_position).m_pos = pcVar1;
      (this->m_position).m_end = pcVar2;
      start.m_end._0_4_ = (int)uVar3;
      (this->m_position).m_last_col = (int)start.m_end;
      local_59 = false;
    }
  }
  Depth_Counter::~Depth_Counter(&local_20);
  return local_59;
}

Assistant:

bool Keyword(const utility::Static_String &t_s) {
        Depth_Counter dc{this};
        SkipWS();
        const auto start = m_position;
        bool retval = Keyword_(t_s);
        // ignore substring matches
        if (retval && m_position.has_more() && char_in_alphabet(*m_position, detail::keyword_alphabet)) {
          m_position = start;
          retval = false;
        }

        return retval;
      }